

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O2

void av1_set_mb_ssim_rdmult_scaling(AV1_COMP *cpi)

{
  int iVar1;
  uint8_t *puVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  int mi_col;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  double dVar15;
  double local_d8;
  double local_c8;
  double local_c0;
  long local_a0;
  long local_90;
  buf_2d buf;
  
  puVar2 = (cpi->source->field_5).buffers[0];
  iVar1 = (cpi->source->field_4).field_0.y_stride;
  uVar10 = ((cpi->common).mi_params.mi_cols + 3) / 4;
  uVar7 = (long)((cpi->common).mi_params.mi_rows + 3) / 4;
  uVar5 = 0;
  if (0 < (int)uVar10) {
    uVar5 = (ulong)uVar10;
  }
  iVar8 = (int)uVar7;
  uVar6 = 0;
  if (0 < iVar8) {
    uVar6 = uVar7 & 0xffffffff;
  }
  local_d8 = 0.0;
  local_a0 = 0;
  for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
    iVar4 = 0;
    local_90 = 0;
    for (uVar13 = 0; uVar13 != uVar5; uVar13 = uVar13 + 1) {
      local_c0 = 0.0;
      local_c8 = 0.0;
      for (lVar9 = local_a0;
          (lVar9 < (int)uVar7 * 4 + 4 && (lVar9 < (cpi->common).mi_params.mi_rows));
          lVar9 = lVar9 + 2) {
        iVar11 = iVar4;
        for (lVar12 = local_90;
            (lVar12 < (int)uVar13 * 4 + 4 && (lVar12 < (cpi->common).mi_params.mi_cols));
            lVar12 = lVar12 + 2) {
          buf.buf = puVar2 + (long)iVar11 + (long)(iVar1 * 4 * (int)lVar9);
          buf.stride = iVar1;
          uVar3 = av1_get_perpixel_variance_facade(cpi,&(cpi->td).mb.e_mbd,&buf,BLOCK_8X8,0);
          local_c0 = local_c0 + (double)uVar3;
          local_c8 = local_c8 + 1.0;
          iVar11 = iVar11 + 8;
        }
      }
      dVar15 = exp((local_c0 / local_c8) * -0.0021489);
      dVar15 = (1.0 - dVar15) * 67.035434 + 17.492222;
      cpi->ssim_rdmult_scaling_factors[uVar13 + uVar7 * (long)(int)uVar10] = dVar15;
      dVar15 = log(dVar15);
      local_d8 = local_d8 + dVar15;
      local_90 = local_90 + 4;
      iVar4 = iVar4 + 0x10;
    }
    local_a0 = local_a0 + 4;
  }
  dVar15 = exp(local_d8 / (double)(int)(iVar8 * uVar10));
  lVar9 = 0;
  for (uVar7 = 0; uVar13 = uVar5, lVar12 = lVar9, uVar7 != uVar6; uVar7 = uVar7 + 1) {
    while (bVar14 = uVar13 != 0, uVar13 = uVar13 - 1, bVar14) {
      *(double *)((long)cpi->ssim_rdmult_scaling_factors + lVar12) =
           *(double *)((long)cpi->ssim_rdmult_scaling_factors + lVar12) / dVar15;
      lVar12 = lVar12 + 8;
    }
    lVar9 = lVar9 + (long)(int)uVar10 * 8;
  }
  return;
}

Assistant:

void av1_set_mb_ssim_rdmult_scaling(AV1_COMP *cpi) {
  const CommonModeInfoParams *const mi_params = &cpi->common.mi_params;
  const MACROBLOCKD *const xd = &cpi->td.mb.e_mbd;
  uint8_t *y_buffer = cpi->source->y_buffer;
  const int y_stride = cpi->source->y_stride;
  const int block_size = BLOCK_16X16;

  const int num_mi_w = mi_size_wide[block_size];
  const int num_mi_h = mi_size_high[block_size];
  const int num_cols = (mi_params->mi_cols + num_mi_w - 1) / num_mi_w;
  const int num_rows = (mi_params->mi_rows + num_mi_h - 1) / num_mi_h;
  double log_sum = 0.0;

  // Loop through each 16x16 block.
  for (int row = 0; row < num_rows; ++row) {
    for (int col = 0; col < num_cols; ++col) {
      double var = 0.0, num_of_var = 0.0;
      const int index = row * num_cols + col;

      // Loop through each 8x8 block.
      for (int mi_row = row * num_mi_h;
           mi_row < mi_params->mi_rows && mi_row < (row + 1) * num_mi_h;
           mi_row += 2) {
        for (int mi_col = col * num_mi_w;
             mi_col < mi_params->mi_cols && mi_col < (col + 1) * num_mi_w;
             mi_col += 2) {
          struct buf_2d buf;
          const int row_offset_y = mi_row << 2;
          const int col_offset_y = mi_col << 2;

          buf.buf = y_buffer + row_offset_y * y_stride + col_offset_y;
          buf.stride = y_stride;

          var += av1_get_perpixel_variance_facade(cpi, xd, &buf, BLOCK_8X8,
                                                  AOM_PLANE_Y);
          num_of_var += 1.0;
        }
      }
      var = var / num_of_var;

      // Curve fitting with an exponential model on all 16x16 blocks from the
      // midres dataset.
      var = 67.035434 * (1 - exp(-0.0021489 * var)) + 17.492222;

      // As per the above computation, var will be in the range of
      // [17.492222, 84.527656], assuming the data type is of infinite
      // precision. The following assert conservatively checks if var is in the
      // range of [17.0, 85.0] to avoid any issues due to the precision of the
      // relevant data type.
      assert(var > 17.0 && var < 85.0);
      cpi->ssim_rdmult_scaling_factors[index] = var;
      log_sum += log(var);
    }
  }

  // As log_sum holds the geometric mean, it will be in the range
  // [17.492222, 84.527656]. Hence, in the below loop, the value of
  // cpi->ssim_rdmult_scaling_factors[index] would be in the range
  // [0.2069, 4.8323].
  log_sum = exp(log_sum / (double)(num_rows * num_cols));

  for (int row = 0; row < num_rows; ++row) {
    for (int col = 0; col < num_cols; ++col) {
      const int index = row * num_cols + col;
      cpi->ssim_rdmult_scaling_factors[index] /= log_sum;
    }
  }
}